

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int ecdh_sha2_nistp(LIBSSH2_SESSION *session,libssh2_curve_type type,uchar *data,size_t data_len,
                   uchar *public_key,size_t public_key_len,EVP_PKEY *private_key,
                   kmdhgGPshakex_state_t *exchange_state)

{
  int iVar1;
  uint uVar2;
  BIGNUM *pBVar3;
  uchar *puVar4;
  size_t sVar5;
  ulong local_230;
  size_t len_17;
  EVP_MD_CTX *hash_17;
  size_t len_16;
  EVP_MD_CTX *hash_16;
  size_t len_15;
  EVP_MD_CTX *hash_15;
  uchar *puStack_1f8;
  int free_key_1;
  uchar *key_1;
  size_t len_14;
  EVP_MD_CTX *hash_14;
  size_t len_13;
  EVP_MD_CTX *hash_13;
  size_t len_12;
  EVP_MD_CTX *hash_12;
  uchar *puStack_1b8;
  int free_key;
  uchar *key;
  size_t len_11;
  EVP_MD_CTX *hash_11;
  size_t len_10;
  EVP_MD_CTX *hash_10;
  size_t len_9;
  EVP_MD_CTX *hash_9;
  size_t len_8;
  EVP_MD_CTX *hash_8;
  size_t len_7;
  EVP_MD_CTX *hash_7;
  size_t len_6;
  EVP_MD_CTX *hash_6;
  int free_secret_1;
  int free_iv_1;
  uchar *secret_1;
  uchar *iv_1;
  size_t len_5;
  EVP_MD_CTX *hash_5;
  size_t len_4;
  EVP_MD_CTX *hash_4;
  size_t len_3;
  EVP_MD_CTX *hash_3;
  size_t len_2;
  EVP_MD_CTX *hash_2;
  size_t len_1;
  EVP_MD_CTX *hash_1;
  size_t len;
  EVP_MD_CTX *hash;
  int free_secret;
  int free_iv;
  uchar *secret;
  uchar *iv;
  size_t digest_length;
  int hok_2;
  EVP_MD_CTX *ctx_2;
  int hok_1;
  EVP_MD_CTX *ctx_1;
  int hok;
  EVP_MD_CTX *ctx;
  EVP_MD_CTX *fingerprint_ctx_2;
  EVP_MD_CTX *fingerprint_ctx_1;
  EVP_MD_CTX *fingerprint_ctx;
  string_buf buf;
  size_t server_public_key_len;
  uchar *server_public_key;
  int rc;
  int ret;
  size_t public_key_len_local;
  uchar *public_key_local;
  size_t data_len_local;
  uchar *data_local;
  LIBSSH2_SESSION *pLStack_18;
  libssh2_curve_type type_local;
  LIBSSH2_SESSION *session_local;
  
  server_public_key._4_4_ = 0;
  _rc = public_key_len;
  public_key_len_local = (size_t)public_key;
  public_key_local = (uchar *)data_len;
  data_len_local = (size_t)data;
  data_local._4_4_ = type;
  pLStack_18 = session;
  if (data_len < 5) {
    iVar1 = _libssh2_error(session,-10,"Host key data is too short");
    return iVar1;
  }
  if (exchange_state->state == libssh2_NB_state_idle) {
    pBVar3 = BN_new();
    exchange_state->k = (BIGNUM *)pBVar3;
    exchange_state->state = libssh2_NB_state_created;
  }
  if (exchange_state->state == libssh2_NB_state_created) {
    fingerprint_ctx = (EVP_MD_CTX *)data_len_local;
    buf.dataptr = public_key_local;
    buf.data = (uchar *)(data_len_local + 1);
    iVar1 = _libssh2_copy_string
                      (pLStack_18,(string_buf *)&fingerprint_ctx,&pLStack_18->server_hostkey,
                       &buf.len);
    if (iVar1 != 0) {
      server_public_key._4_4_ =
           _libssh2_error(pLStack_18,-6,"Unable to allocate memory for a copy of the host ECDH key")
      ;
      goto LAB_001221c1;
    }
    pLStack_18->server_hostkey_len = (uint32_t)buf.len;
    iVar1 = _libssh2_md5_init(&fingerprint_ctx_1);
    if (((iVar1 == 0) ||
        (iVar1 = _libssh2_md5_update(&fingerprint_ctx_1,pLStack_18->server_hostkey,
                                     (ulong)pLStack_18->server_hostkey_len), iVar1 == 0)) ||
       (iVar1 = _libssh2_md5_final(&fingerprint_ctx_1,pLStack_18->server_hostkey_md5), iVar1 == 0))
    {
      pLStack_18->server_hostkey_md5_valid = 0;
    }
    else {
      pLStack_18->server_hostkey_md5_valid = 1;
    }
    iVar1 = _libssh2_sha1_init(&fingerprint_ctx_2);
    if (((iVar1 == 0) ||
        (iVar1 = _libssh2_sha1_update
                           (&fingerprint_ctx_2,pLStack_18->server_hostkey,
                            (ulong)pLStack_18->server_hostkey_len), iVar1 == 0)) ||
       (iVar1 = _libssh2_sha1_final(&fingerprint_ctx_2,pLStack_18->server_hostkey_sha1), iVar1 == 0)
       ) {
      pLStack_18->server_hostkey_sha1_valid = 0;
    }
    else {
      pLStack_18->server_hostkey_sha1_valid = 1;
    }
    iVar1 = _libssh2_sha256_init(&ctx);
    if (((iVar1 == 0) ||
        (iVar1 = _libssh2_sha256_update
                           (&ctx,pLStack_18->server_hostkey,(ulong)pLStack_18->server_hostkey_len),
        iVar1 == 0)) ||
       (iVar1 = _libssh2_sha256_final(&ctx,pLStack_18->server_hostkey_sha256), iVar1 == 0)) {
      pLStack_18->server_hostkey_sha256_valid = 0;
    }
    else {
      pLStack_18->server_hostkey_sha256_valid = 1;
    }
    iVar1 = (*pLStack_18->hostkey->init)
                      (pLStack_18,pLStack_18->server_hostkey,(ulong)pLStack_18->server_hostkey_len,
                       &pLStack_18->server_hostkey_abstract);
    if (iVar1 != 0) {
      server_public_key._4_4_ =
           _libssh2_error(pLStack_18,-10,"Unable to initialize hostkey importer ECDH");
      goto LAB_001221c1;
    }
    iVar1 = _libssh2_get_string((string_buf *)&fingerprint_ctx,(uchar **)&server_public_key_len,
                                &buf.len);
    if (iVar1 != 0) {
      server_public_key._4_4_ = _libssh2_error(pLStack_18,-0xe,"Unexpected key length ECDH");
      goto LAB_001221c1;
    }
    iVar1 = _libssh2_get_string((string_buf *)&fingerprint_ctx,&exchange_state->h_sig,
                                &exchange_state->h_sig_len);
    if (iVar1 != 0) {
      server_public_key._4_4_ = _libssh2_error(pLStack_18,-10,"Unexpected ECDH server sig length");
      goto LAB_001221c1;
    }
    server_public_key._0_4_ =
         _libssh2_ecdh_gen_k(&exchange_state->k,private_key,(uchar *)server_public_key_len,buf.len);
    if ((int)server_public_key != 0) {
      server_public_key._4_4_ = _libssh2_error(pLStack_18,-5,"Unable to create ECDH shared secret");
      goto LAB_001221c1;
    }
    iVar1 = BN_num_bits((BIGNUM *)exchange_state->k);
    exchange_state->k_value_len = (long)((iVar1 + 7) / 8 + 5);
    iVar1 = BN_num_bits((BIGNUM *)exchange_state->k);
    if (iVar1 % 8 != 0) {
      exchange_state->k_value_len = exchange_state->k_value_len - 1;
    }
    puVar4 = (uchar *)(*pLStack_18->alloc)(exchange_state->k_value_len,&pLStack_18->abstract);
    exchange_state->k_value = puVar4;
    if (exchange_state->k_value == (uchar *)0x0) {
      server_public_key._4_4_ = _libssh2_error(pLStack_18,-6,"Unable to allocate buffer for ECDH K")
      ;
      goto LAB_001221c1;
    }
    _libssh2_htonu32(exchange_state->k_value,(int)exchange_state->k_value_len - 4);
    iVar1 = BN_num_bits((BIGNUM *)exchange_state->k);
    if (iVar1 % 8 == 0) {
      exchange_state->k_value[4] = '\0';
      BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + 5);
    }
    else {
      BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + 4);
    }
    if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP256) {
      iVar1 = _libssh2_sha256_init((EVP_MD_CTX **)&stack0xffffffffffffff70);
      if (iVar1 == 0) {
        server_public_key._0_4_ = -1;
      }
      else {
        exchange_state->exchange_hash = &stack0xffffffffffffff70;
        ctx_1._4_4_ = 1;
        if ((pLStack_18->local).banner == (uchar *)0x0) {
          _libssh2_htonu32(exchange_state->h_sig_comp,0x1a);
          uVar2 = _libssh2_sha256_update
                            ((EVP_MD_CTX **)&stack0xffffffffffffff70,exchange_state->h_sig_comp,4);
          ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
          uVar2 = _libssh2_sha256_update
                            ((EVP_MD_CTX **)&stack0xffffffffffffff70,"SSH-2.0-libssh2_1.11.1_DEV",
                             0x1a);
          ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        }
        else {
          sVar5 = strlen((char *)(pLStack_18->local).banner);
          _libssh2_htonu32(exchange_state->h_sig_comp,(int)sVar5 - 2);
          uVar2 = _libssh2_sha256_update
                            ((EVP_MD_CTX **)&stack0xffffffffffffff70,exchange_state->h_sig_comp,4);
          ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
          puVar4 = (pLStack_18->local).banner;
          sVar5 = strlen((char *)(pLStack_18->local).banner);
          uVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&stack0xffffffffffffff70,puVar4,sVar5 - 2);
          ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        }
        sVar5 = strlen((char *)(pLStack_18->remote).banner);
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)sVar5);
        uVar2 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff70,exchange_state->h_sig_comp,4);
        ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        puVar4 = (pLStack_18->remote).banner;
        sVar5 = strlen((char *)(pLStack_18->remote).banner);
        uVar2 = _libssh2_sha256_update((EVP_MD_CTX **)&stack0xffffffffffffff70,puVar4,sVar5);
        ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)(pLStack_18->local).kexinit_len);
        uVar2 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff70,exchange_state->h_sig_comp,4);
        ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        uVar2 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff70,(pLStack_18->local).kexinit,
                           (pLStack_18->local).kexinit_len);
        ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)(pLStack_18->remote).kexinit_len);
        uVar2 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff70,exchange_state->h_sig_comp,4);
        ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        uVar2 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff70,(pLStack_18->remote).kexinit,
                           (pLStack_18->remote).kexinit_len);
        ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,pLStack_18->server_hostkey_len);
        uVar2 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff70,exchange_state->h_sig_comp,4);
        ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        uVar2 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff70,pLStack_18->server_hostkey,
                           (ulong)pLStack_18->server_hostkey_len);
        ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)_rc);
        uVar2 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff70,exchange_state->h_sig_comp,4);
        ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        uVar2 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff70,(void *)public_key_len_local,_rc)
        ;
        ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)buf.len);
        uVar2 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff70,exchange_state->h_sig_comp,4);
        ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        uVar2 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff70,(void *)server_public_key_len,
                           buf.len);
        ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        uVar2 = _libssh2_sha256_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff70,exchange_state->k_value,
                           exchange_state->k_value_len);
        ctx_1._4_4_ = uVar2 & ctx_1._4_4_;
        if ((ctx_1._4_4_ == 0) ||
           (iVar1 = _libssh2_sha256_final
                              ((EVP_MD_CTX **)&stack0xffffffffffffff70,exchange_state->h_sig_comp),
           iVar1 == 0)) {
          server_public_key._0_4_ = -1;
        }
        else {
          iVar1 = (*pLStack_18->hostkey->sig_verify)
                            (pLStack_18,exchange_state->h_sig,exchange_state->h_sig_len,
                             exchange_state->h_sig_comp,0x20,&pLStack_18->server_hostkey_abstract);
          if (iVar1 != 0) {
            server_public_key._0_4_ = -1;
          }
        }
      }
    }
    else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP384) {
      iVar1 = _libssh2_sha384_init((EVP_MD_CTX **)&stack0xffffffffffffff60);
      if (iVar1 == 0) {
        server_public_key._0_4_ = -1;
      }
      else {
        exchange_state->exchange_hash = &stack0xffffffffffffff60;
        ctx_2._4_4_ = 1;
        if ((pLStack_18->local).banner == (uchar *)0x0) {
          _libssh2_htonu32(exchange_state->h_sig_comp,0x1a);
          uVar2 = _libssh2_sha384_update
                            ((EVP_MD_CTX **)&stack0xffffffffffffff60,exchange_state->h_sig_comp,4);
          ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
          uVar2 = _libssh2_sha384_update
                            ((EVP_MD_CTX **)&stack0xffffffffffffff60,"SSH-2.0-libssh2_1.11.1_DEV",
                             0x1a);
          ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        }
        else {
          sVar5 = strlen((char *)(pLStack_18->local).banner);
          _libssh2_htonu32(exchange_state->h_sig_comp,(int)sVar5 - 2);
          uVar2 = _libssh2_sha384_update
                            ((EVP_MD_CTX **)&stack0xffffffffffffff60,exchange_state->h_sig_comp,4);
          ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
          puVar4 = (pLStack_18->local).banner;
          sVar5 = strlen((char *)(pLStack_18->local).banner);
          uVar2 = _libssh2_sha384_update((EVP_MD_CTX **)&stack0xffffffffffffff60,puVar4,sVar5 - 2);
          ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        }
        sVar5 = strlen((char *)(pLStack_18->remote).banner);
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)sVar5);
        uVar2 = _libssh2_sha384_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff60,exchange_state->h_sig_comp,4);
        ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        puVar4 = (pLStack_18->remote).banner;
        sVar5 = strlen((char *)(pLStack_18->remote).banner);
        uVar2 = _libssh2_sha384_update((EVP_MD_CTX **)&stack0xffffffffffffff60,puVar4,sVar5);
        ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)(pLStack_18->local).kexinit_len);
        uVar2 = _libssh2_sha384_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff60,exchange_state->h_sig_comp,4);
        ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        uVar2 = _libssh2_sha384_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff60,(pLStack_18->local).kexinit,
                           (pLStack_18->local).kexinit_len);
        ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)(pLStack_18->remote).kexinit_len);
        uVar2 = _libssh2_sha384_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff60,exchange_state->h_sig_comp,4);
        ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        uVar2 = _libssh2_sha384_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff60,(pLStack_18->remote).kexinit,
                           (pLStack_18->remote).kexinit_len);
        ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,pLStack_18->server_hostkey_len);
        uVar2 = _libssh2_sha384_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff60,exchange_state->h_sig_comp,4);
        ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        uVar2 = _libssh2_sha384_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff60,pLStack_18->server_hostkey,
                           (ulong)pLStack_18->server_hostkey_len);
        ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)_rc);
        uVar2 = _libssh2_sha384_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff60,exchange_state->h_sig_comp,4);
        ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        uVar2 = _libssh2_sha384_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff60,(void *)public_key_len_local,_rc)
        ;
        ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)buf.len);
        uVar2 = _libssh2_sha384_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff60,exchange_state->h_sig_comp,4);
        ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        uVar2 = _libssh2_sha384_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff60,(void *)server_public_key_len,
                           buf.len);
        ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        uVar2 = _libssh2_sha384_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff60,exchange_state->k_value,
                           exchange_state->k_value_len);
        ctx_2._4_4_ = uVar2 & ctx_2._4_4_;
        if ((ctx_2._4_4_ == 0) ||
           (iVar1 = _libssh2_sha384_final
                              ((EVP_MD_CTX **)&stack0xffffffffffffff60,exchange_state->h_sig_comp),
           iVar1 == 0)) {
          server_public_key._0_4_ = -1;
        }
        else {
          iVar1 = (*pLStack_18->hostkey->sig_verify)
                            (pLStack_18,exchange_state->h_sig,exchange_state->h_sig_len,
                             exchange_state->h_sig_comp,0x30,&pLStack_18->server_hostkey_abstract);
          if (iVar1 != 0) {
            server_public_key._0_4_ = -1;
          }
        }
      }
    }
    else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP521) {
      iVar1 = _libssh2_sha512_init((EVP_MD_CTX **)&stack0xffffffffffffff50);
      if (iVar1 == 0) {
        server_public_key._0_4_ = -1;
      }
      else {
        exchange_state->exchange_hash = &stack0xffffffffffffff50;
        digest_length._4_4_ = 1;
        if ((pLStack_18->local).banner == (uchar *)0x0) {
          _libssh2_htonu32(exchange_state->h_sig_comp,0x1a);
          uVar2 = _libssh2_sha512_update
                            ((EVP_MD_CTX **)&stack0xffffffffffffff50,exchange_state->h_sig_comp,4);
          digest_length._4_4_ = uVar2 & digest_length._4_4_;
          uVar2 = _libssh2_sha512_update
                            ((EVP_MD_CTX **)&stack0xffffffffffffff50,"SSH-2.0-libssh2_1.11.1_DEV",
                             0x1a);
          digest_length._4_4_ = uVar2 & digest_length._4_4_;
        }
        else {
          sVar5 = strlen((char *)(pLStack_18->local).banner);
          _libssh2_htonu32(exchange_state->h_sig_comp,(int)sVar5 - 2);
          uVar2 = _libssh2_sha512_update
                            ((EVP_MD_CTX **)&stack0xffffffffffffff50,exchange_state->h_sig_comp,4);
          digest_length._4_4_ = uVar2 & digest_length._4_4_;
          puVar4 = (pLStack_18->local).banner;
          sVar5 = strlen((char *)(pLStack_18->local).banner);
          uVar2 = _libssh2_sha512_update((EVP_MD_CTX **)&stack0xffffffffffffff50,puVar4,sVar5 - 2);
          digest_length._4_4_ = uVar2 & digest_length._4_4_;
        }
        sVar5 = strlen((char *)(pLStack_18->remote).banner);
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)sVar5);
        uVar2 = _libssh2_sha512_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff50,exchange_state->h_sig_comp,4);
        digest_length._4_4_ = uVar2 & digest_length._4_4_;
        puVar4 = (pLStack_18->remote).banner;
        sVar5 = strlen((char *)(pLStack_18->remote).banner);
        uVar2 = _libssh2_sha512_update((EVP_MD_CTX **)&stack0xffffffffffffff50,puVar4,sVar5);
        digest_length._4_4_ = uVar2 & digest_length._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)(pLStack_18->local).kexinit_len);
        uVar2 = _libssh2_sha512_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff50,exchange_state->h_sig_comp,4);
        digest_length._4_4_ = uVar2 & digest_length._4_4_;
        uVar2 = _libssh2_sha512_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff50,(pLStack_18->local).kexinit,
                           (pLStack_18->local).kexinit_len);
        digest_length._4_4_ = uVar2 & digest_length._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)(pLStack_18->remote).kexinit_len);
        uVar2 = _libssh2_sha512_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff50,exchange_state->h_sig_comp,4);
        digest_length._4_4_ = uVar2 & digest_length._4_4_;
        uVar2 = _libssh2_sha512_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff50,(pLStack_18->remote).kexinit,
                           (pLStack_18->remote).kexinit_len);
        digest_length._4_4_ = uVar2 & digest_length._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,pLStack_18->server_hostkey_len);
        uVar2 = _libssh2_sha512_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff50,exchange_state->h_sig_comp,4);
        digest_length._4_4_ = uVar2 & digest_length._4_4_;
        uVar2 = _libssh2_sha512_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff50,pLStack_18->server_hostkey,
                           (ulong)pLStack_18->server_hostkey_len);
        digest_length._4_4_ = uVar2 & digest_length._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)_rc);
        uVar2 = _libssh2_sha512_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff50,exchange_state->h_sig_comp,4);
        digest_length._4_4_ = uVar2 & digest_length._4_4_;
        uVar2 = _libssh2_sha512_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff50,(void *)public_key_len_local,_rc)
        ;
        digest_length._4_4_ = uVar2 & digest_length._4_4_;
        _libssh2_htonu32(exchange_state->h_sig_comp,(uint32_t)buf.len);
        uVar2 = _libssh2_sha512_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff50,exchange_state->h_sig_comp,4);
        digest_length._4_4_ = uVar2 & digest_length._4_4_;
        uVar2 = _libssh2_sha512_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff50,(void *)server_public_key_len,
                           buf.len);
        digest_length._4_4_ = uVar2 & digest_length._4_4_;
        uVar2 = _libssh2_sha512_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff50,exchange_state->k_value,
                           exchange_state->k_value_len);
        digest_length._4_4_ = uVar2 & digest_length._4_4_;
        if ((digest_length._4_4_ == 0) ||
           (iVar1 = _libssh2_sha512_final
                              ((EVP_MD_CTX **)&stack0xffffffffffffff50,exchange_state->h_sig_comp),
           iVar1 == 0)) {
          server_public_key._0_4_ = -1;
        }
        else {
          iVar1 = (*pLStack_18->hostkey->sig_verify)
                            (pLStack_18,exchange_state->h_sig,exchange_state->h_sig_len,
                             exchange_state->h_sig_comp,0x40,&pLStack_18->server_hostkey_abstract);
          if (iVar1 != 0) {
            server_public_key._0_4_ = -1;
          }
        }
      }
    }
    if ((int)server_public_key != 0) {
      server_public_key._4_4_ =
           _libssh2_error(pLStack_18,-0xb,"Unable to verify hostkey signature ECDH");
      goto LAB_001221c1;
    }
    exchange_state->c = '\x15';
    exchange_state->state = libssh2_NB_state_sent;
  }
  if (exchange_state->state == libssh2_NB_state_sent) {
    server_public_key._0_4_ =
         _libssh2_transport_send(pLStack_18,&exchange_state->c,1,(uchar *)0x0,0);
    if ((int)server_public_key == -0x25) {
      return -0x25;
    }
    if ((int)server_public_key != 0) {
      server_public_key._4_4_ =
           _libssh2_error(pLStack_18,(int)server_public_key,"Unable to send NEWKEYS message ECDH");
      goto LAB_001221c1;
    }
    exchange_state->state = libssh2_NB_state_sent2;
  }
  if (exchange_state->state == libssh2_NB_state_sent2) {
    server_public_key._0_4_ =
         _libssh2_packet_require
                   (pLStack_18,'\x15',&exchange_state->tmp,&exchange_state->tmp_len,0,(uchar *)0x0,0
                    ,&exchange_state->req_state);
    if ((int)server_public_key == -0x25) {
      return -0x25;
    }
    if ((int)server_public_key == 0) {
      pLStack_18->state = pLStack_18->state | 4;
      (*pLStack_18->free)(exchange_state->tmp,&pLStack_18->abstract);
      if (pLStack_18->session_id == (uchar *)0x0) {
        iv = (uchar *)0x0;
        if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP256) {
          iv = (uchar *)0x20;
        }
        else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP384) {
          iv = (uchar *)0x30;
        }
        else {
          if (data_local._4_4_ != LIBSSH2_EC_CURVE_NISTP521) {
            server_public_key._4_4_ =
                 _libssh2_error(pLStack_18,-5,"Unknown SHA digest for EC curve");
            goto LAB_001221c1;
          }
          iv = (uchar *)0x40;
        }
        puVar4 = (uchar *)(*pLStack_18->alloc)((size_t)iv,&pLStack_18->abstract);
        pLStack_18->session_id = puVar4;
        if (pLStack_18->session_id == (uchar *)0x0) {
          server_public_key._4_4_ =
               _libssh2_error(pLStack_18,-6,"Unable to allocate buffer for SHA digest");
          goto LAB_001221c1;
        }
        memcpy(pLStack_18->session_id,exchange_state->h_sig_comp,(size_t)iv);
        pLStack_18->session_id_len = (uint32_t)iv;
      }
      if (((pLStack_18->local).crypt)->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*((pLStack_18->local).crypt)->dtor)(pLStack_18,&(pLStack_18->local).crypt_abstract);
      }
      if (((pLStack_18->local).crypt)->init !=
          (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
           *)0x0) {
        secret = (uchar *)0x0;
        _free_secret = (uchar *)0x0;
        hash._4_4_ = 0;
        hash._0_4_ = 0;
        if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP256) {
          hash_1 = (EVP_MD_CTX *)0x0;
          secret = (uchar *)(*pLStack_18->alloc)
                                      ((long)(((pLStack_18->local).crypt)->iv_len + 0x20),
                                       &pLStack_18->abstract);
          if (secret != (uchar *)0x0) {
            for (; hash_1 < (EVP_MD_CTX *)(long)((pLStack_18->local).crypt)->iv_len;
                hash_1 = hash_1 + 0x20) {
              iVar1 = _libssh2_sha256_init((EVP_MD_CTX **)&len);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha256_update
                                     ((EVP_MD_CTX **)&len,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha256_update
                                    ((EVP_MD_CTX **)&len,exchange_state->h_sig_comp,0x20),
                 iVar1 == 0)) {
                (*pLStack_18->free)(secret,&pLStack_18->abstract);
                secret = (uchar *)0x0;
                break;
              }
              if (hash_1 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha256_update((EVP_MD_CTX **)&len,"A",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha256_update
                                      ((EVP_MD_CTX **)&len,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(secret,&pLStack_18->abstract);
                  secret = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha256_update((EVP_MD_CTX **)&len,secret,(size_t)hash_1);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(secret,&pLStack_18->abstract);
                  secret = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha256_final((EVP_MD_CTX **)&len,secret + (long)hash_1);
              if (iVar1 == 0) {
                (*pLStack_18->free)(secret,&pLStack_18->abstract);
                secret = (uchar *)0x0;
                break;
              }
            }
          }
        }
        else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP384) {
          hash_2 = (EVP_MD_CTX *)0x0;
          secret = (uchar *)(*pLStack_18->alloc)
                                      ((long)(((pLStack_18->local).crypt)->iv_len + 0x30),
                                       &pLStack_18->abstract);
          if (secret != (uchar *)0x0) {
            for (; hash_2 < (EVP_MD_CTX *)(long)((pLStack_18->local).crypt)->iv_len;
                hash_2 = hash_2 + 0x30) {
              iVar1 = _libssh2_sha384_init((EVP_MD_CTX **)&len_1);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha384_update
                                     ((EVP_MD_CTX **)&len_1,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha384_update
                                    ((EVP_MD_CTX **)&len_1,exchange_state->h_sig_comp,0x30),
                 iVar1 == 0)) {
                (*pLStack_18->free)(secret,&pLStack_18->abstract);
                secret = (uchar *)0x0;
                break;
              }
              if (hash_2 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha384_update((EVP_MD_CTX **)&len_1,"A",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha384_update
                                      ((EVP_MD_CTX **)&len_1,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(secret,&pLStack_18->abstract);
                  secret = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha384_update((EVP_MD_CTX **)&len_1,secret,(size_t)hash_2);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(secret,&pLStack_18->abstract);
                  secret = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha384_final((EVP_MD_CTX **)&len_1,secret + (long)hash_2);
              if (iVar1 == 0) {
                (*pLStack_18->free)(secret,&pLStack_18->abstract);
                secret = (uchar *)0x0;
                break;
              }
            }
          }
        }
        else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP521) {
          hash_3 = (EVP_MD_CTX *)0x0;
          secret = (uchar *)(*pLStack_18->alloc)
                                      ((long)(((pLStack_18->local).crypt)->iv_len + 0x40),
                                       &pLStack_18->abstract);
          if (secret != (uchar *)0x0) {
            for (; hash_3 < (EVP_MD_CTX *)(long)((pLStack_18->local).crypt)->iv_len;
                hash_3 = hash_3 + 0x40) {
              iVar1 = _libssh2_sha512_init((EVP_MD_CTX **)&len_2);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha512_update
                                     ((EVP_MD_CTX **)&len_2,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha512_update
                                    ((EVP_MD_CTX **)&len_2,exchange_state->h_sig_comp,0x40),
                 iVar1 == 0)) {
                (*pLStack_18->free)(secret,&pLStack_18->abstract);
                secret = (uchar *)0x0;
                break;
              }
              if (hash_3 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&len_2,"A",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha512_update
                                      ((EVP_MD_CTX **)&len_2,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(secret,&pLStack_18->abstract);
                  secret = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&len_2,secret,(size_t)hash_3);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(secret,&pLStack_18->abstract);
                  secret = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha512_final((EVP_MD_CTX **)&len_2,secret + (long)hash_3);
              if (iVar1 == 0) {
                (*pLStack_18->free)(secret,&pLStack_18->abstract);
                secret = (uchar *)0x0;
                break;
              }
            }
          }
        }
        if (secret == (uchar *)0x0) {
          server_public_key._4_4_ = -1;
          goto LAB_001221c1;
        }
        if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP256) {
          hash_4 = (EVP_MD_CTX *)0x0;
          if (_free_secret == (uchar *)0x0) {
            _free_secret = (uchar *)(*pLStack_18->alloc)
                                              ((long)(((pLStack_18->local).crypt)->secret_len + 0x20
                                                     ),&pLStack_18->abstract);
          }
          if (_free_secret != (uchar *)0x0) {
            for (; hash_4 < (EVP_MD_CTX *)(long)((pLStack_18->local).crypt)->secret_len;
                hash_4 = hash_4 + 0x20) {
              iVar1 = _libssh2_sha256_init((EVP_MD_CTX **)&len_3);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha256_update
                                     ((EVP_MD_CTX **)&len_3,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha256_update
                                    ((EVP_MD_CTX **)&len_3,exchange_state->h_sig_comp,0x20),
                 iVar1 == 0)) {
                (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
                _free_secret = (uchar *)0x0;
                break;
              }
              if (hash_4 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha256_update((EVP_MD_CTX **)&len_3,"C",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha256_update
                                      ((EVP_MD_CTX **)&len_3,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
                  _free_secret = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha256_update((EVP_MD_CTX **)&len_3,_free_secret,(size_t)hash_4);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
                  _free_secret = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha256_final((EVP_MD_CTX **)&len_3,_free_secret + (long)hash_4);
              if (iVar1 == 0) {
                (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
                _free_secret = (uchar *)0x0;
                break;
              }
            }
          }
        }
        else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP384) {
          hash_5 = (EVP_MD_CTX *)0x0;
          if (_free_secret == (uchar *)0x0) {
            _free_secret = (uchar *)(*pLStack_18->alloc)
                                              ((long)(((pLStack_18->local).crypt)->secret_len + 0x30
                                                     ),&pLStack_18->abstract);
          }
          if (_free_secret != (uchar *)0x0) {
            for (; hash_5 < (EVP_MD_CTX *)(long)((pLStack_18->local).crypt)->secret_len;
                hash_5 = hash_5 + 0x30) {
              iVar1 = _libssh2_sha384_init((EVP_MD_CTX **)&len_4);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha384_update
                                     ((EVP_MD_CTX **)&len_4,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha384_update
                                    ((EVP_MD_CTX **)&len_4,exchange_state->h_sig_comp,0x30),
                 iVar1 == 0)) {
                (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
                _free_secret = (uchar *)0x0;
                break;
              }
              if (hash_5 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha384_update((EVP_MD_CTX **)&len_4,"C",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha384_update
                                      ((EVP_MD_CTX **)&len_4,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
                  _free_secret = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha384_update((EVP_MD_CTX **)&len_4,_free_secret,(size_t)hash_5);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
                  _free_secret = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha384_final((EVP_MD_CTX **)&len_4,_free_secret + (long)hash_5);
              if (iVar1 == 0) {
                (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
                _free_secret = (uchar *)0x0;
                break;
              }
            }
          }
        }
        else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP521) {
          iv_1 = (uchar *)0x0;
          if (_free_secret == (uchar *)0x0) {
            _free_secret = (uchar *)(*pLStack_18->alloc)
                                              ((long)(((pLStack_18->local).crypt)->secret_len + 0x40
                                                     ),&pLStack_18->abstract);
          }
          if (_free_secret != (uchar *)0x0) {
            for (; iv_1 < (uchar *)(long)((pLStack_18->local).crypt)->secret_len; iv_1 = iv_1 + 0x40
                ) {
              iVar1 = _libssh2_sha512_init((EVP_MD_CTX **)&len_5);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha512_update
                                     ((EVP_MD_CTX **)&len_5,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha512_update
                                    ((EVP_MD_CTX **)&len_5,exchange_state->h_sig_comp,0x40),
                 iVar1 == 0)) {
                (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
                _free_secret = (uchar *)0x0;
                break;
              }
              if (iv_1 == (uchar *)0x0) {
                iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&len_5,"C",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha512_update
                                      ((EVP_MD_CTX **)&len_5,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
                  _free_secret = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&len_5,_free_secret,(size_t)iv_1);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
                  _free_secret = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha512_final((EVP_MD_CTX **)&len_5,_free_secret + (long)iv_1);
              if (iVar1 == 0) {
                (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
                _free_secret = (uchar *)0x0;
                break;
              }
            }
          }
        }
        if (_free_secret == (uchar *)0x0) {
          (*pLStack_18->free)(secret,&pLStack_18->abstract);
          server_public_key._4_4_ = -5;
          goto LAB_001221c1;
        }
        iVar1 = (*((pLStack_18->local).crypt)->init)
                          (pLStack_18,(pLStack_18->local).crypt,secret,(int *)((long)&hash + 4),
                           _free_secret,(int *)&hash,1,&(pLStack_18->local).crypt_abstract);
        if (iVar1 != 0) {
          (*pLStack_18->free)(secret,&pLStack_18->abstract);
          (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
          server_public_key._4_4_ = -5;
          goto LAB_001221c1;
        }
        if (hash._4_4_ != 0) {
          explicit_bzero(secret,(long)((pLStack_18->local).crypt)->iv_len);
          (*pLStack_18->free)(secret,&pLStack_18->abstract);
        }
        if ((int)hash != 0) {
          explicit_bzero(_free_secret,(long)((pLStack_18->local).crypt)->secret_len);
          (*pLStack_18->free)(_free_secret,&pLStack_18->abstract);
        }
      }
      if (((pLStack_18->remote).crypt)->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*((pLStack_18->remote).crypt)->dtor)(pLStack_18,&(pLStack_18->remote).crypt_abstract);
      }
      if (((pLStack_18->remote).crypt)->init !=
          (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
           *)0x0) {
        secret_1 = (uchar *)0x0;
        _free_secret_1 = (uchar *)0x0;
        hash_6._4_4_ = 0;
        hash_6._0_4_ = 0;
        if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP256) {
          hash_7 = (EVP_MD_CTX *)0x0;
          secret_1 = (uchar *)(*pLStack_18->alloc)
                                        ((long)(((pLStack_18->remote).crypt)->iv_len + 0x20),
                                         &pLStack_18->abstract);
          if (secret_1 != (uchar *)0x0) {
            for (; hash_7 < (EVP_MD_CTX *)(long)((pLStack_18->remote).crypt)->iv_len;
                hash_7 = hash_7 + 0x20) {
              iVar1 = _libssh2_sha256_init((EVP_MD_CTX **)&len_6);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha256_update
                                     ((EVP_MD_CTX **)&len_6,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha256_update
                                    ((EVP_MD_CTX **)&len_6,exchange_state->h_sig_comp,0x20),
                 iVar1 == 0)) {
                (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
                secret_1 = (uchar *)0x0;
                break;
              }
              if (hash_7 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha256_update((EVP_MD_CTX **)&len_6,"B",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha256_update
                                      ((EVP_MD_CTX **)&len_6,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
                  secret_1 = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha256_update((EVP_MD_CTX **)&len_6,secret_1,(size_t)hash_7);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
                  secret_1 = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha256_final((EVP_MD_CTX **)&len_6,secret_1 + (long)hash_7);
              if (iVar1 == 0) {
                (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
                secret_1 = (uchar *)0x0;
                break;
              }
            }
          }
        }
        else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP384) {
          hash_8 = (EVP_MD_CTX *)0x0;
          secret_1 = (uchar *)(*pLStack_18->alloc)
                                        ((long)(((pLStack_18->remote).crypt)->iv_len + 0x30),
                                         &pLStack_18->abstract);
          if (secret_1 != (uchar *)0x0) {
            for (; hash_8 < (EVP_MD_CTX *)(long)((pLStack_18->remote).crypt)->iv_len;
                hash_8 = hash_8 + 0x30) {
              iVar1 = _libssh2_sha384_init((EVP_MD_CTX **)&len_7);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha384_update
                                     ((EVP_MD_CTX **)&len_7,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha384_update
                                    ((EVP_MD_CTX **)&len_7,exchange_state->h_sig_comp,0x30),
                 iVar1 == 0)) {
                (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
                secret_1 = (uchar *)0x0;
                break;
              }
              if (hash_8 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha384_update((EVP_MD_CTX **)&len_7,"B",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha384_update
                                      ((EVP_MD_CTX **)&len_7,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
                  secret_1 = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha384_update((EVP_MD_CTX **)&len_7,secret_1,(size_t)hash_8);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
                  secret_1 = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha384_final((EVP_MD_CTX **)&len_7,secret_1 + (long)hash_8);
              if (iVar1 == 0) {
                (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
                secret_1 = (uchar *)0x0;
                break;
              }
            }
          }
        }
        else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP521) {
          hash_9 = (EVP_MD_CTX *)0x0;
          secret_1 = (uchar *)(*pLStack_18->alloc)
                                        ((long)(((pLStack_18->remote).crypt)->iv_len + 0x40),
                                         &pLStack_18->abstract);
          if (secret_1 != (uchar *)0x0) {
            for (; hash_9 < (EVP_MD_CTX *)(long)((pLStack_18->remote).crypt)->iv_len;
                hash_9 = hash_9 + 0x40) {
              iVar1 = _libssh2_sha512_init((EVP_MD_CTX **)&len_8);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha512_update
                                     ((EVP_MD_CTX **)&len_8,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha512_update
                                    ((EVP_MD_CTX **)&len_8,exchange_state->h_sig_comp,0x40),
                 iVar1 == 0)) {
                (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
                secret_1 = (uchar *)0x0;
                break;
              }
              if (hash_9 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&len_8,"B",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha512_update
                                      ((EVP_MD_CTX **)&len_8,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
                  secret_1 = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&len_8,secret_1,(size_t)hash_9);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
                  secret_1 = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha512_final((EVP_MD_CTX **)&len_8,secret_1 + (long)hash_9);
              if (iVar1 == 0) {
                (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
                secret_1 = (uchar *)0x0;
                break;
              }
            }
          }
        }
        if (secret_1 == (uchar *)0x0) {
          server_public_key._4_4_ = -5;
          goto LAB_001221c1;
        }
        if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP256) {
          hash_10 = (EVP_MD_CTX *)0x0;
          if (_free_secret_1 == (uchar *)0x0) {
            _free_secret_1 =
                 (uchar *)(*pLStack_18->alloc)
                                    ((long)(((pLStack_18->remote).crypt)->secret_len + 0x20),
                                     &pLStack_18->abstract);
          }
          if (_free_secret_1 != (uchar *)0x0) {
            for (; hash_10 < (EVP_MD_CTX *)(long)((pLStack_18->remote).crypt)->secret_len;
                hash_10 = hash_10 + 0x20) {
              iVar1 = _libssh2_sha256_init((EVP_MD_CTX **)&len_9);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha256_update
                                     ((EVP_MD_CTX **)&len_9,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha256_update
                                    ((EVP_MD_CTX **)&len_9,exchange_state->h_sig_comp,0x20),
                 iVar1 == 0)) {
                (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
                _free_secret_1 = (uchar *)0x0;
                break;
              }
              if (hash_10 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha256_update((EVP_MD_CTX **)&len_9,"D",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha256_update
                                      ((EVP_MD_CTX **)&len_9,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
                  _free_secret_1 = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha256_update((EVP_MD_CTX **)&len_9,_free_secret_1,(size_t)hash_10)
                ;
                if (iVar1 == 0) {
                  (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
                  _free_secret_1 = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha256_final((EVP_MD_CTX **)&len_9,_free_secret_1 + (long)hash_10);
              if (iVar1 == 0) {
                (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
                _free_secret_1 = (uchar *)0x0;
                break;
              }
            }
          }
        }
        else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP384) {
          hash_11 = (EVP_MD_CTX *)0x0;
          if (_free_secret_1 == (uchar *)0x0) {
            _free_secret_1 =
                 (uchar *)(*pLStack_18->alloc)
                                    ((long)(((pLStack_18->remote).crypt)->secret_len + 0x30),
                                     &pLStack_18->abstract);
          }
          if (_free_secret_1 != (uchar *)0x0) {
            for (; hash_11 < (EVP_MD_CTX *)(long)((pLStack_18->remote).crypt)->secret_len;
                hash_11 = hash_11 + 0x30) {
              iVar1 = _libssh2_sha384_init((EVP_MD_CTX **)&len_10);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha384_update
                                     ((EVP_MD_CTX **)&len_10,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha384_update
                                    ((EVP_MD_CTX **)&len_10,exchange_state->h_sig_comp,0x30),
                 iVar1 == 0)) {
                (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
                _free_secret_1 = (uchar *)0x0;
                break;
              }
              if (hash_11 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha384_update((EVP_MD_CTX **)&len_10,"D",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha384_update
                                      ((EVP_MD_CTX **)&len_10,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
                  _free_secret_1 = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha384_update
                                  ((EVP_MD_CTX **)&len_10,_free_secret_1,(size_t)hash_11);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
                  _free_secret_1 = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha384_final((EVP_MD_CTX **)&len_10,_free_secret_1 + (long)hash_11);
              if (iVar1 == 0) {
                (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
                _free_secret_1 = (uchar *)0x0;
                break;
              }
            }
          }
        }
        else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP521) {
          key = (uchar *)0x0;
          if (_free_secret_1 == (uchar *)0x0) {
            _free_secret_1 =
                 (uchar *)(*pLStack_18->alloc)
                                    ((long)(((pLStack_18->remote).crypt)->secret_len + 0x40),
                                     &pLStack_18->abstract);
          }
          if (_free_secret_1 != (uchar *)0x0) {
            for (; key < (uchar *)(long)((pLStack_18->remote).crypt)->secret_len; key = key + 0x40)
            {
              iVar1 = _libssh2_sha512_init((EVP_MD_CTX **)&len_11);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha512_update
                                     ((EVP_MD_CTX **)&len_11,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha512_update
                                    ((EVP_MD_CTX **)&len_11,exchange_state->h_sig_comp,0x40),
                 iVar1 == 0)) {
                (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
                _free_secret_1 = (uchar *)0x0;
                break;
              }
              if (key == (uchar *)0x0) {
                iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&len_11,"D",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha512_update
                                      ((EVP_MD_CTX **)&len_11,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
                  _free_secret_1 = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&len_11,_free_secret_1,(size_t)key);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
                  _free_secret_1 = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha512_final((EVP_MD_CTX **)&len_11,_free_secret_1 + (long)key);
              if (iVar1 == 0) {
                (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
                _free_secret_1 = (uchar *)0x0;
                break;
              }
            }
          }
        }
        if (_free_secret_1 == (uchar *)0x0) {
          (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
          server_public_key._4_4_ = -5;
          goto LAB_001221c1;
        }
        iVar1 = (*((pLStack_18->remote).crypt)->init)
                          (pLStack_18,(pLStack_18->remote).crypt,secret_1,(int *)((long)&hash_6 + 4)
                           ,_free_secret_1,(int *)&hash_6,0,&(pLStack_18->remote).crypt_abstract);
        if (iVar1 != 0) {
          (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
          (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
          server_public_key._4_4_ = -5;
          goto LAB_001221c1;
        }
        if (hash_6._4_4_ != 0) {
          explicit_bzero(secret_1,(long)((pLStack_18->remote).crypt)->iv_len);
          (*pLStack_18->free)(secret_1,&pLStack_18->abstract);
        }
        if ((int)hash_6 != 0) {
          explicit_bzero(_free_secret_1,(long)((pLStack_18->remote).crypt)->secret_len);
          (*pLStack_18->free)(_free_secret_1,&pLStack_18->abstract);
        }
      }
      if (((pLStack_18->local).mac)->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*((pLStack_18->local).mac)->dtor)(pLStack_18,&(pLStack_18->local).mac_abstract);
      }
      if (((pLStack_18->local).mac)->init !=
          (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
        puStack_1b8 = (uchar *)0x0;
        hash_12._4_4_ = 0;
        if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP256) {
          hash_13 = (EVP_MD_CTX *)0x0;
          puStack_1b8 = (uchar *)(*pLStack_18->alloc)
                                           ((long)(((pLStack_18->local).mac)->key_len + 0x20),
                                            &pLStack_18->abstract);
          if (puStack_1b8 != (uchar *)0x0) {
            for (; hash_13 < (EVP_MD_CTX *)(long)((pLStack_18->local).mac)->key_len;
                hash_13 = hash_13 + 0x20) {
              iVar1 = _libssh2_sha256_init((EVP_MD_CTX **)&len_12);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha256_update
                                     ((EVP_MD_CTX **)&len_12,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha256_update
                                    ((EVP_MD_CTX **)&len_12,exchange_state->h_sig_comp,0x20),
                 iVar1 == 0)) {
                (*pLStack_18->free)(puStack_1b8,&pLStack_18->abstract);
                puStack_1b8 = (uchar *)0x0;
                break;
              }
              if (hash_13 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha256_update((EVP_MD_CTX **)&len_12,"E",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha256_update
                                      ((EVP_MD_CTX **)&len_12,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(puStack_1b8,&pLStack_18->abstract);
                  puStack_1b8 = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha256_update((EVP_MD_CTX **)&len_12,puStack_1b8,(size_t)hash_13);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(puStack_1b8,&pLStack_18->abstract);
                  puStack_1b8 = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha256_final((EVP_MD_CTX **)&len_12,puStack_1b8 + (long)hash_13);
              if (iVar1 == 0) {
                (*pLStack_18->free)(puStack_1b8,&pLStack_18->abstract);
                puStack_1b8 = (uchar *)0x0;
                break;
              }
            }
          }
        }
        else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP384) {
          hash_14 = (EVP_MD_CTX *)0x0;
          puStack_1b8 = (uchar *)(*pLStack_18->alloc)
                                           ((long)(((pLStack_18->local).mac)->key_len + 0x30),
                                            &pLStack_18->abstract);
          if (puStack_1b8 != (uchar *)0x0) {
            for (; hash_14 < (EVP_MD_CTX *)(long)((pLStack_18->local).mac)->key_len;
                hash_14 = hash_14 + 0x30) {
              iVar1 = _libssh2_sha384_init((EVP_MD_CTX **)&len_13);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha384_update
                                     ((EVP_MD_CTX **)&len_13,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha384_update
                                    ((EVP_MD_CTX **)&len_13,exchange_state->h_sig_comp,0x30),
                 iVar1 == 0)) {
                (*pLStack_18->free)(puStack_1b8,&pLStack_18->abstract);
                puStack_1b8 = (uchar *)0x0;
                break;
              }
              if (hash_14 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha384_update((EVP_MD_CTX **)&len_13,"E",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha384_update
                                      ((EVP_MD_CTX **)&len_13,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(puStack_1b8,&pLStack_18->abstract);
                  puStack_1b8 = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha384_update((EVP_MD_CTX **)&len_13,puStack_1b8,(size_t)hash_14);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(puStack_1b8,&pLStack_18->abstract);
                  puStack_1b8 = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha384_final((EVP_MD_CTX **)&len_13,puStack_1b8 + (long)hash_14);
              if (iVar1 == 0) {
                (*pLStack_18->free)(puStack_1b8,&pLStack_18->abstract);
                puStack_1b8 = (uchar *)0x0;
                break;
              }
            }
          }
        }
        else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP521) {
          key_1 = (uchar *)0x0;
          puStack_1b8 = (uchar *)(*pLStack_18->alloc)
                                           ((long)(((pLStack_18->local).mac)->key_len + 0x40),
                                            &pLStack_18->abstract);
          if (puStack_1b8 != (uchar *)0x0) {
            for (; key_1 < (uchar *)(long)((pLStack_18->local).mac)->key_len; key_1 = key_1 + 0x40)
            {
              iVar1 = _libssh2_sha512_init((EVP_MD_CTX **)&len_14);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha512_update
                                     ((EVP_MD_CTX **)&len_14,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha512_update
                                    ((EVP_MD_CTX **)&len_14,exchange_state->h_sig_comp,0x40),
                 iVar1 == 0)) {
                (*pLStack_18->free)(puStack_1b8,&pLStack_18->abstract);
                puStack_1b8 = (uchar *)0x0;
                break;
              }
              if (key_1 == (uchar *)0x0) {
                iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&len_14,"E",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha512_update
                                      ((EVP_MD_CTX **)&len_14,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(puStack_1b8,&pLStack_18->abstract);
                  puStack_1b8 = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&len_14,puStack_1b8,(size_t)key_1);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(puStack_1b8,&pLStack_18->abstract);
                  puStack_1b8 = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha512_final((EVP_MD_CTX **)&len_14,puStack_1b8 + (long)key_1);
              if (iVar1 == 0) {
                (*pLStack_18->free)(puStack_1b8,&pLStack_18->abstract);
                puStack_1b8 = (uchar *)0x0;
                break;
              }
            }
          }
        }
        if (puStack_1b8 == (uchar *)0x0) {
          server_public_key._4_4_ = -5;
          goto LAB_001221c1;
        }
        (*((pLStack_18->local).mac)->init)
                  (pLStack_18,puStack_1b8,(int *)((long)&hash_12 + 4),
                   &(pLStack_18->local).mac_abstract);
        if (hash_12._4_4_ != 0) {
          explicit_bzero(puStack_1b8,(long)((pLStack_18->local).mac)->key_len);
          (*pLStack_18->free)(puStack_1b8,&pLStack_18->abstract);
        }
      }
      if (((pLStack_18->remote).mac)->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*((pLStack_18->remote).mac)->dtor)(pLStack_18,&(pLStack_18->remote).mac_abstract);
      }
      if (((pLStack_18->remote).mac)->init !=
          (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
        puStack_1f8 = (uchar *)0x0;
        hash_15._4_4_ = 0;
        if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP256) {
          hash_16 = (EVP_MD_CTX *)0x0;
          puStack_1f8 = (uchar *)(*pLStack_18->alloc)
                                           ((long)(((pLStack_18->remote).mac)->key_len + 0x20),
                                            &pLStack_18->abstract);
          if (puStack_1f8 != (uchar *)0x0) {
            for (; hash_16 < (EVP_MD_CTX *)(long)((pLStack_18->remote).mac)->key_len;
                hash_16 = hash_16 + 0x20) {
              iVar1 = _libssh2_sha256_init((EVP_MD_CTX **)&len_15);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha256_update
                                     ((EVP_MD_CTX **)&len_15,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha256_update
                                    ((EVP_MD_CTX **)&len_15,exchange_state->h_sig_comp,0x20),
                 iVar1 == 0)) {
                (*pLStack_18->free)(puStack_1f8,&pLStack_18->abstract);
                puStack_1f8 = (uchar *)0x0;
                break;
              }
              if (hash_16 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha256_update((EVP_MD_CTX **)&len_15,"F",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha256_update
                                      ((EVP_MD_CTX **)&len_15,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(puStack_1f8,&pLStack_18->abstract);
                  puStack_1f8 = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha256_update((EVP_MD_CTX **)&len_15,puStack_1f8,(size_t)hash_16);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(puStack_1f8,&pLStack_18->abstract);
                  puStack_1f8 = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha256_final((EVP_MD_CTX **)&len_15,puStack_1f8 + (long)hash_16);
              if (iVar1 == 0) {
                (*pLStack_18->free)(puStack_1f8,&pLStack_18->abstract);
                puStack_1f8 = (uchar *)0x0;
                break;
              }
            }
          }
        }
        else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP384) {
          hash_17 = (EVP_MD_CTX *)0x0;
          puStack_1f8 = (uchar *)(*pLStack_18->alloc)
                                           ((long)(((pLStack_18->remote).mac)->key_len + 0x30),
                                            &pLStack_18->abstract);
          if (puStack_1f8 != (uchar *)0x0) {
            for (; hash_17 < (EVP_MD_CTX *)(long)((pLStack_18->remote).mac)->key_len;
                hash_17 = hash_17 + 0x30) {
              iVar1 = _libssh2_sha384_init((EVP_MD_CTX **)&len_16);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha384_update
                                     ((EVP_MD_CTX **)&len_16,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha384_update
                                    ((EVP_MD_CTX **)&len_16,exchange_state->h_sig_comp,0x30),
                 iVar1 == 0)) {
                (*pLStack_18->free)(puStack_1f8,&pLStack_18->abstract);
                puStack_1f8 = (uchar *)0x0;
                break;
              }
              if (hash_17 == (EVP_MD_CTX *)0x0) {
                iVar1 = _libssh2_sha384_update((EVP_MD_CTX **)&len_16,"F",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha384_update
                                      ((EVP_MD_CTX **)&len_16,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(puStack_1f8,&pLStack_18->abstract);
                  puStack_1f8 = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha384_update((EVP_MD_CTX **)&len_16,puStack_1f8,(size_t)hash_17);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(puStack_1f8,&pLStack_18->abstract);
                  puStack_1f8 = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha384_final((EVP_MD_CTX **)&len_16,puStack_1f8 + (long)hash_17);
              if (iVar1 == 0) {
                (*pLStack_18->free)(puStack_1f8,&pLStack_18->abstract);
                puStack_1f8 = (uchar *)0x0;
                break;
              }
            }
          }
        }
        else if (data_local._4_4_ == LIBSSH2_EC_CURVE_NISTP521) {
          local_230 = 0;
          puStack_1f8 = (uchar *)(*pLStack_18->alloc)
                                           ((long)(((pLStack_18->remote).mac)->key_len + 0x40),
                                            &pLStack_18->abstract);
          if (puStack_1f8 != (uchar *)0x0) {
            for (; local_230 < (ulong)(long)((pLStack_18->remote).mac)->key_len;
                local_230 = local_230 + 0x40) {
              iVar1 = _libssh2_sha512_init((EVP_MD_CTX **)&len_17);
              if (((iVar1 == 0) ||
                  (iVar1 = _libssh2_sha512_update
                                     ((EVP_MD_CTX **)&len_17,exchange_state->k_value,
                                      exchange_state->k_value_len), iVar1 == 0)) ||
                 (iVar1 = _libssh2_sha512_update
                                    ((EVP_MD_CTX **)&len_17,exchange_state->h_sig_comp,0x40),
                 iVar1 == 0)) {
                (*pLStack_18->free)(puStack_1f8,&pLStack_18->abstract);
                puStack_1f8 = (uchar *)0x0;
                break;
              }
              if (local_230 == 0) {
                iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&len_17,"F",1);
                if ((iVar1 == 0) ||
                   (iVar1 = _libssh2_sha512_update
                                      ((EVP_MD_CTX **)&len_17,pLStack_18->session_id,
                                       (ulong)pLStack_18->session_id_len), iVar1 == 0)) {
                  (*pLStack_18->free)(puStack_1f8,&pLStack_18->abstract);
                  puStack_1f8 = (uchar *)0x0;
                  break;
                }
              }
              else {
                iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&len_17,puStack_1f8,local_230);
                if (iVar1 == 0) {
                  (*pLStack_18->free)(puStack_1f8,&pLStack_18->abstract);
                  puStack_1f8 = (uchar *)0x0;
                  break;
                }
              }
              iVar1 = _libssh2_sha512_final((EVP_MD_CTX **)&len_17,puStack_1f8 + local_230);
              if (iVar1 == 0) {
                (*pLStack_18->free)(puStack_1f8,&pLStack_18->abstract);
                puStack_1f8 = (uchar *)0x0;
                break;
              }
            }
          }
        }
        if (puStack_1f8 == (uchar *)0x0) {
          server_public_key._4_4_ = -5;
          goto LAB_001221c1;
        }
        (*((pLStack_18->remote).mac)->init)
                  (pLStack_18,puStack_1f8,(int *)((long)&hash_15 + 4),
                   &(pLStack_18->remote).mac_abstract);
        if (hash_15._4_4_ != 0) {
          explicit_bzero(puStack_1f8,(long)((pLStack_18->remote).mac)->key_len);
          (*pLStack_18->free)(puStack_1f8,&pLStack_18->abstract);
        }
      }
      if (((pLStack_18->local).comp != (LIBSSH2_COMP_METHOD *)0x0) &&
         (((pLStack_18->local).comp)->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)
         ) {
        (*((pLStack_18->local).comp)->dtor)(pLStack_18,1,&(pLStack_18->local).comp_abstract);
      }
      if ((((pLStack_18->local).comp == (LIBSSH2_COMP_METHOD *)0x0) ||
          (((pLStack_18->local).comp)->init == (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
          )) || (iVar1 = (*((pLStack_18->local).comp)->init)
                                   (pLStack_18,1,&(pLStack_18->local).comp_abstract), iVar1 == 0)) {
        if (((pLStack_18->remote).comp != (LIBSSH2_COMP_METHOD *)0x0) &&
           (((pLStack_18->remote).comp)->dtor !=
            (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
          (*((pLStack_18->remote).comp)->dtor)(pLStack_18,0,&(pLStack_18->remote).comp_abstract);
        }
        if ((((pLStack_18->remote).comp != (LIBSSH2_COMP_METHOD *)0x0) &&
            (((pLStack_18->remote).comp)->init !=
             (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) &&
           (iVar1 = (*((pLStack_18->remote).comp)->init)
                              (pLStack_18,0,&(pLStack_18->remote).comp_abstract), iVar1 != 0)) {
          server_public_key._4_4_ = -5;
        }
      }
      else {
        server_public_key._4_4_ = -5;
      }
    }
    else {
      server_public_key._4_4_ =
           _libssh2_error(pLStack_18,(int)server_public_key,"Timed out waiting for NEWKEYS ECDH");
    }
  }
LAB_001221c1:
  BN_clear_free((BIGNUM *)exchange_state->k);
  exchange_state->k = (BIGNUM *)0x0;
  if (exchange_state->k_value != (uchar *)0x0) {
    (*pLStack_18->free)(exchange_state->k_value,&pLStack_18->abstract);
    exchange_state->k_value = (uchar *)0x0;
  }
  exchange_state->state = libssh2_NB_state_idle;
  return server_public_key._4_4_;
}

Assistant:

static int ecdh_sha2_nistp(LIBSSH2_SESSION *session, libssh2_curve_type type,
                           unsigned char *data, size_t data_len,
                           unsigned char *public_key,
                           size_t public_key_len, _libssh2_ec_key *private_key,
                           kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;

    if(data_len < 5) {
        ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                             "Host key data is too short");
        return ret;
    }

    if(exchange_state->state == libssh2_NB_state_idle) {

        /* Setup initial values */
        exchange_state->k = _libssh2_bn_init();

        exchange_state->state = libssh2_NB_state_created;
    }

    if(exchange_state->state == libssh2_NB_state_created) {
        /* parse INIT reply data */

        /* host key K_S */
        unsigned char *server_public_key;
        size_t server_public_key_len;
        struct string_buf buf;

        buf.data = data;
        buf.len = data_len;
        buf.dataptr = buf.data;
        buf.dataptr++; /* Advance past packet type */

        if(_libssh2_copy_string(session, &buf, &(session->server_hostkey),
                                &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host ECDH key");
            goto clean_exit;
        }

        session->server_hostkey_len = (uint32_t)server_public_key_len;

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if(libssh2_md5_init(&fingerprint_ctx) &&
               libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                  session->server_hostkey_len) &&
               libssh2_md5_final(fingerprint_ctx,
                                 session->server_hostkey_md5)) {
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if(libssh2_sha1_init(&fingerprint_ctx) &&
               libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len) &&
               libssh2_sha1_final(fingerprint_ctx,
                                  session->server_hostkey_sha1)) {
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;
            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */

        /* SHA256 */
        {
            libssh2_sha256_ctx fingerprint_ctx;

            if(libssh2_sha256_init(&fingerprint_ctx) &&
               libssh2_sha256_update(fingerprint_ctx, session->server_hostkey,
                                     session->server_hostkey_len) &&
               libssh2_sha256_final(fingerprint_ctx,
                                    session->server_hostkey_sha256)) {
                session->server_hostkey_sha256_valid = TRUE;
            }
            else {
                session->server_hostkey_sha256_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char *base64Fingerprint = NULL;
            _libssh2_base64_encode(session,
                                   (const char *)
                                   session->server_hostkey_sha256,
                                   SHA256_DIGEST_LENGTH, &base64Fingerprint);
            if(base64Fingerprint) {
                _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                               "Server's SHA256 Fingerprint: %s",
                               base64Fingerprint));
                LIBSSH2_FREE(session, base64Fingerprint);
            }
        }
#endif /* LIBSSH2DEBUG */

        if(session->hostkey->init(session, session->server_hostkey,
                                  session->server_hostkey_len,
                                  &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer "
                                 "ECDH");
            goto clean_exit;
        }

        /* server public key Q_S */
        if(_libssh2_get_string(&buf, &server_public_key,
                               &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected key length ECDH");
            goto clean_exit;
        }

        /* server signature */
        if(_libssh2_get_string(&buf, &exchange_state->h_sig,
           &(exchange_state->h_sig_len))) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unexpected ECDH server sig length");
            goto clean_exit;
        }

        /* Compute the shared secret K */
        rc = _libssh2_ecdh_gen_k(&exchange_state->k, private_key,
                                 server_public_key, server_public_key_len);
        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                 "Unable to create ECDH shared secret");
            goto clean_exit;
        }

        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
        LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if(!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for ECDH K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         (uint32_t)(exchange_state->k_value_len - 4));
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 4);
        }
        else {
            exchange_state->k_value[4] = 0;
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 5);
        }

        /* verify hash */

        switch(type) {
            case LIBSSH2_EC_CURVE_NISTP256:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(256);
                break;
            case LIBSSH2_EC_CURVE_NISTP384:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(384);
                break;
            case LIBSSH2_EC_CURVE_NISTP521:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(512);
                break;
        }

        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature "
                                 "ECDH");
            goto clean_exit;
        }

        exchange_state->c = SSH_MSG_NEWKEYS;
        exchange_state->state = libssh2_NB_state_sent;
    }

    if(exchange_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send NEWKEYS message ECDH");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if(exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timed out waiting for NEWKEYS ECDH");
            goto clean_exit;
        }

        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Received NEWKEYS message ECDH"));

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if(!session->session_id) {

            size_t digest_length = 0;

            if(type == LIBSSH2_EC_CURVE_NISTP256)
                digest_length = SHA256_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP384)
                digest_length = SHA384_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP521)
                digest_length = SHA512_DIGEST_LENGTH;
            else{
                ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                     "Unknown SHA digest for EC curve");
                goto clean_exit;

            }
            session->session_id = LIBSSH2_ALLOC(session, digest_length);
            if(!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for "
                                     "SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   digest_length);
             session->session_id_len = (uint32_t)digest_length;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "session_id calculated"));
        }

        /* Cleanup any existing cipher */
        if(session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if(session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->local.crypt->
                                                 iv_len, "A");
            if(!iv) {
                ret = -1;
                goto clean_exit;
            }

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->local.crypt->
                                                 secret_len, "C");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated"));

        if(session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if(session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->remote.crypt->
                                                 iv_len, "B");

            if(!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->remote.crypt->
                                                 secret_len, "D");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated"));

        if(session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if(session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->local.mac->
                                                 key_len, "E");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated"));

        if(session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if(session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->remote.mac->
                                                 key_len, "F");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated"));

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if(session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if(session->local.comp && session->local.comp->init) {
            if(session->local.comp->init(session, 1,
                                         &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized"));

        if(session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if(session->remote.comp && session->remote.comp->init) {
            if(session->remote.comp->init(session, 0,
                                          &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized"));
    }

clean_exit:
    _libssh2_bn_free(exchange_state->k);
    exchange_state->k = NULL;

    if(exchange_state->k_value) {
        LIBSSH2_FREE(session, exchange_state->k_value);
        exchange_state->k_value = NULL;
    }

    exchange_state->state = libssh2_NB_state_idle;

    return ret;
}